

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O3

bool __thiscall libtorrent::torrent_handle::need_save_resume_data(torrent_handle *this)

{
  bool bVar1;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> all_categories;
  
  bVar1 = sync_call_ret<bool,bool(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resume_data_flags_tag,void>)const,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::resume_data_flags_tag,void>const&>
                    (this,false,0x34ad00,
                     (bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)0x0);
  return bVar1;
}

Assistant:

bool torrent_handle::need_save_resume_data() const
	{
		auto const all_categories
			= torrent_handle::if_counters_changed
			| torrent_handle::if_download_progress
			| torrent_handle::if_config_changed
			| torrent_handle::if_state_changed
			| torrent_handle::if_metadata_changed
			;
		return sync_call_ret<bool>(false, &aux::torrent::need_save_resume_data, all_categories);
	}